

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

CharFormat testing::internal::PrintAsStringLiteralTo(char32_t c,ostream *os)

{
  ostream *os_local;
  char32_t c_local;
  
  if (c == L'\"') {
    std::operator<<(os,"\\\"");
    os_local._4_4_ = kSpecialEscape;
  }
  else if (c == L'\'') {
    std::operator<<(os,"\'");
    os_local._4_4_ = kAsIs;
  }
  else {
    os_local._4_4_ = PrintAsCharLiteralTo<char32_t>(c,os);
  }
  return os_local._4_4_;
}

Assistant:

static CharFormat PrintAsStringLiteralTo(char32_t c, ostream* os) {
  switch (c) {
    case L'\'':
      *os << "'";
      return kAsIs;
    case L'"':
      *os << "\\\"";
      return kSpecialEscape;
    default:
      return PrintAsCharLiteralTo(c, os);
  }
}